

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O1

_Bool Hacl_Bignum256_32_mod_exp_consttime
                (uint32_t *n,uint32_t *a,uint32_t bBits,uint32_t *b,uint32_t *res)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t i;
  int iVar4;
  long lVar5;
  uint32_t local_58 [10];
  
  uVar1 = exp_check(n,a,bBits,b);
  lVar5 = 0;
  uVar3 = 0;
  do {
    uVar2 = FStar_UInt32_eq_mask(n[lVar5],0);
    uVar3 = (uVar3 ^ (uint)lVar5) & uVar2 ^ (uint)lVar5;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  if (uVar1 == 0xffffffff) {
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    *(byte *)(local_58 + (uVar3 & 0x7ffffff)) = (byte)local_58[uVar3 & 0x7ffffff] | 1;
    iVar4 = uVar3 * 0x20 + -0x200;
    if (iVar4 != 0) {
      iVar4 = -iVar4;
      do {
        Hacl_Bignum256_32_add_mod(n,local_58,local_58,local_58);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    uVar2 = Hacl_Bignum_ModInvLimb_mod_inv_uint32(*n);
    exp_consttime_precomp(n,uVar2,local_58,a,bBits,b,res);
  }
  else {
    res[4] = 0;
    res[5] = 0;
    res[6] = 0;
    res[7] = 0;
    res[0] = 0;
    res[1] = 0;
    res[2] = 0;
    res[3] = 0;
  }
  return uVar1 == 0xffffffff;
}

Assistant:

bool
Hacl_Bignum256_32_mod_exp_consttime(
  uint32_t *n,
  uint32_t *a,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *res
)
{
  uint32_t is_valid_m = exp_check(n, a, bBits, b);
  uint32_t nBits = 32U * Hacl_Bignum_Lib_bn_get_top_index_u32(8U, n);
  if (is_valid_m == 0xFFFFFFFFU)
  {
    exp_consttime(nBits, n, a, bBits, b, res);
  }
  else
  {
    memset(res, 0U, 8U * sizeof (uint32_t));
  }
  return is_valid_m == 0xFFFFFFFFU;
}